

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall google::protobuf::strings::AlphaNum::AlphaNum(AlphaNum *this,Hex hex)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = hex.value;
  lVar2 = 0;
  uVar5 = uVar4 | 1L << ((ulong)(byte)((char)(hex.spec << 2) - 4) & 0x3f);
  do {
    lVar3 = lVar2;
    this->digits[lVar3 + 0x1f] = "0123456789abcdef"[(uint)uVar4 & 0xf];
    uVar4 = uVar4 >> 4;
    bVar1 = 0xf < uVar5;
    lVar2 = lVar3 + -1;
    uVar5 = uVar5 >> 4;
  } while (bVar1);
  this->piece_data_ = this->digits + lVar3 + 0x1f;
  this->piece_size_ = -(lVar3 + -1);
  return;
}

Assistant:

AlphaNum::AlphaNum(strings::Hex hex) {
  char *const end = &digits[kFastToBufferSize];
  char *writer = end;
  uint64 value = hex.value;
  uint64 width = hex.spec;
  // We accomplish minimum width by OR'ing in 0x10000 to the user's value,
  // where 0x10000 is the smallest hex number that is as wide as the user
  // asked for.
  uint64 mask = ((static_cast<uint64>(1) << (width - 1) * 4)) | value;
  static const char hexdigits[] = "0123456789abcdef";
  do {
    *--writer = hexdigits[value & 0xF];
    value >>= 4;
    mask >>= 4;
  } while (mask != 0);
  piece_data_ = writer;
  piece_size_ = end - writer;
}